

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

bool __thiscall
cmLocalUnixMakefileGenerator3::UpdateDependencies
          (cmLocalUnixMakefileGenerator3 *this,string *tgtInfo,bool verbose,bool color)

{
  cmMakefile *pcVar1;
  size_type sVar2;
  cmFileTimeCache *this_00;
  pointer pcVar3;
  pointer pcVar4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  Encoding EVar9;
  string *psVar10;
  path *this_01;
  undefined7 in_register_00000009;
  char *extraout_RDX;
  bool bVar11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  string_view arg;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  int result;
  int result_1;
  string depends;
  string internalDependFile;
  string targetDir;
  cmDependsCompiler depsManager;
  string targetName_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depFiles;
  DependencyMap validDependencies;
  cmDependsC checker;
  undefined1 local_938 [39];
  allocator<char> local_911;
  string local_910;
  string local_8f0;
  undefined4 local_8cc;
  undefined1 local_8c8 [32];
  _Base_ptr local_8a8;
  size_t local_8a0;
  string local_898;
  cmDependsCompiler local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  undefined1 local_848 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_828;
  undefined1 local_810 [16];
  cmFileTimeCache local_800 [10];
  undefined1 local_5a8 [16];
  undefined1 local_598 [16];
  _List local_588;
  char *local_580;
  undefined8 local_570;
  _Alloc_hider local_568;
  char *local_560;
  
  local_8cc = (undefined4)CONCAT71(in_register_00000009,color);
  bVar6 = cmMakefile::ReadListFile
                    ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,tgtInfo);
  if ((((!bVar6) || (cmSystemTools::s_ErrorOccurred != false)) ||
      (cmSystemTools::s_FatalErrorOccurred != false)) ||
     (bVar6 = cmSystemTools::GetInterruptFlag(), bVar6)) {
    local_5a8._0_8_ = local_598;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_5a8,"Target DependInfo.cmake file not found","");
    cmSystemTools::Error((string *)local_5a8);
    if ((undefined1 *)local_5a8._0_8_ != local_598) {
      operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
    }
  }
  CheckMultipleOutputs(this,verbose);
  cmsys::SystemTools::GetFilenamePath(&local_898,tgtInfo);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_5a8._0_8_ = local_598;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a8,"CMAKE_DEPENDS_LANGUAGES","");
  psVar10 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_5a8);
  sVar2 = psVar10->_M_string_length;
  if ((undefined1 *)local_5a8._0_8_ != local_598) {
    operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
  }
  if (sVar2 == 0) {
    bVar6 = true;
  }
  else {
    local_8c8._0_8_ = local_8c8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_8c8,local_898._M_dataplus._M_p,
               local_898._M_dataplus._M_p + local_898._M_string_length);
    std::__cxx11::string::append(local_8c8);
    local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_8f0,local_898._M_dataplus._M_p,
               local_898._M_dataplus._M_p + local_898._M_string_length);
    std::__cxx11::string::append((char *)&local_8f0);
    this_00 = (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
               CMakeInstance->FileTimeCache)._M_t.
              super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>._M_t.
              super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>.
              super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl;
    bVar7 = cmFileTimeCache::Compare(this_00,(string *)local_8c8,tgtInfo,(int *)local_938);
    bVar11 = (int)local_938._0_4_ < 0;
    if (verbose && (!bVar7 || bVar11)) {
      local_598._8_8_ = (tgtInfo->_M_dataplus)._M_p;
      local_598._0_8_ = tgtInfo->_M_string_length;
      local_5a8._0_8_ = (size_type *)0xa;
      local_5a8._8_8_ = "Dependee \"";
      local_588._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
              )0x1a;
      local_580 = "\" is newer than depender \"";
      local_570 = local_8c8._0_8_;
      local_568._M_p = (pointer)0x3;
      local_560 = "\".\n";
      views._M_len = 5;
      views._M_array = (iterator)local_5a8;
      cmCatViews_abi_cxx11_((string *)local_810,views);
      cmSystemTools::Stdout((string *)local_810);
      if ((cmFileTimeCache *)local_810._0_8_ != local_800) {
        operator_delete((void *)local_810._0_8_,(long)local_800[0].Cache._M_h._M_buckets + 1);
      }
    }
    psVar10 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    local_5a8._8_8_ = (psVar10->_M_dataplus)._M_p;
    local_5a8._0_8_ = psVar10->_M_string_length;
    local_598._0_8_ = &DAT_0000002b;
    local_598._8_8_ = "/CMakeFiles/CMakeDirectoryInformation.cmake";
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_5a8;
    cmCatViews_abi_cxx11_((string *)local_810,views_00);
    bVar6 = cmFileTimeCache::Compare
                      (this_00,(string *)local_8c8,(string *)local_810,(int *)&local_910);
    if (bVar6 && -1 < (int)local_910._M_dataplus._M_p) {
      if ((cmFileTimeCache *)local_810._0_8_ != local_800) {
        operator_delete((void *)local_810._0_8_,(long)local_800[0].Cache._M_h._M_buckets + 1);
      }
      local_800[0].Cache._M_h._M_bucket_count = (long)local_810 + 8;
      local_810._8_4_ = _S_red;
      local_800[0].Cache._M_h._M_buckets = (__buckets_ptr)0x0;
      local_800[0].Cache._M_h._M_element_count = 0;
      local_800[0].Cache._M_h._M_before_begin._M_nxt =
           (_Hash_node_base *)local_800[0].Cache._M_h._M_bucket_count;
      cmDependsC::cmDependsC((cmDependsC *)local_5a8);
      local_598[0] = verbose;
      local_598._8_8_ = this_00;
      bVar8 = cmDepends::Check((cmDepends *)local_5a8,&local_8f0,(string *)local_8c8,
                               (DependencyMap *)local_810);
      cmDependsC::~cmDependsC((cmDependsC *)local_5a8);
      bVar6 = true;
      if ((!bVar7 || bVar11) || !bVar8) goto LAB_004f811a;
    }
    else {
      if (verbose) {
        local_598._0_8_ = CONCAT44(local_810._12_4_,local_810._8_4_);
        local_5a8._0_8_ = (size_type *)0xa;
        local_5a8._8_8_ = "Dependee \"";
        local_598._8_8_ = local_810._0_8_;
        local_588._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
             (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
                )0x1a;
        local_580 = "\" is newer than depender \"";
        local_570 = local_8c8._0_8_;
        local_568._M_p = (pointer)0x3;
        local_560 = "\".\n";
        views_01._M_len = 5;
        views_01._M_array = (iterator)local_5a8;
        cmCatViews_abi_cxx11_((string *)local_938,views_01);
        cmSystemTools::Stdout((string *)local_938);
        if ((cmFileTimeCache *)local_938._0_8_ != (cmFileTimeCache *)(local_938 + 0x10)) {
          operator_delete((void *)local_938._0_8_,local_938._16_8_ + 1);
        }
      }
      if ((cmFileTimeCache *)local_810._0_8_ != local_800) {
        operator_delete((void *)local_810._0_8_,(long)local_800[0].Cache._M_h._M_buckets + 1);
      }
      local_800[0].Cache._M_h._M_bucket_count = (long)local_810 + 8;
      local_810._8_4_ = _S_red;
      local_800[0].Cache._M_h._M_buckets = (__buckets_ptr)0x0;
      local_800[0].Cache._M_h._M_element_count = 0;
      local_800[0].Cache._M_h._M_before_begin._M_nxt =
           (_Hash_node_base *)local_800[0].Cache._M_h._M_bucket_count;
LAB_004f811a:
      if (verbose) {
        cmsys::SystemTools::GetFilenameName((string *)local_938,&local_898);
        std::__cxx11::string::substr((ulong)local_5a8,(ulong)local_938);
        std::__cxx11::string::operator=((string *)local_938,(string *)local_5a8);
        if ((undefined1 *)local_5a8._0_8_ != local_598) {
          operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
        }
        local_5a8._0_8_ = (size_type *)0x20;
        local_5a8._8_8_ = "Scanning dependencies of target ";
        local_598._0_8_ = local_938._8_8_;
        local_598._8_8_ = local_938._0_8_;
        views_02._M_len = 2;
        views_02._M_array = (iterator)local_5a8;
        cmCatViews_abi_cxx11_(&local_910,views_02);
        cmSystemTools::MakefileColorEcho(0x106,local_910._M_dataplus._M_p,true,local_8cc._0_1_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_910._M_dataplus._M_p != &local_910.field_2) {
          operator_delete(local_910._M_dataplus._M_p,local_910.field_2._M_allocated_capacity + 1);
        }
        if ((cmFileTimeCache *)local_938._0_8_ != (cmFileTimeCache *)(local_938 + 0x10)) {
          operator_delete((void *)local_938._0_8_,local_938._16_8_ + 1);
        }
      }
      bVar6 = ScanDependencies(this,&local_898,&local_8f0,(string *)local_8c8,
                               (DependencyMap *)local_810);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)local_810);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
      operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_8c8._0_8_ != local_8c8 + 0x10) {
      operator_delete((void *)local_8c8._0_8_,local_8c8._16_8_ + 1);
    }
  }
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_5a8._0_8_ = local_598;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5a8,"CMAKE_DEPENDS_DEPENDENCY_FILES","");
  psVar10 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_5a8);
  local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
  pcVar3 = (psVar10->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8f0,pcVar3,pcVar3 + psVar10->_M_string_length);
  if ((undefined1 *)local_5a8._0_8_ != local_598) {
    operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
  }
  if (local_8f0._M_string_length == 0) goto LAB_004f87a9;
  arg._M_str = local_8f0._M_dataplus._M_p;
  arg._M_len = local_8f0._M_string_length;
  cmExpandedList_abi_cxx11_(&local_828,arg,true);
  local_938._0_8_ = local_938 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_938,local_898._M_dataplus._M_p,
             local_898._M_dataplus._M_p + local_898._M_string_length);
  std::__cxx11::string::append(local_938);
  local_910._M_dataplus._M_p = (pointer)&local_910.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_910,local_898._M_dataplus._M_p,
             local_898._M_dataplus._M_p + local_898._M_string_length);
  std::__cxx11::string::append((char *)&local_910);
  local_8c8._24_8_ = local_8c8 + 8;
  local_8c8._8_4_ = _S_red;
  local_8c8._16_8_ = 0;
  local_8a0 = 0;
  local_878.Verbose = false;
  local_878.LocalGenerator = (cmLocalUnixMakefileGenerator3 *)0x0;
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_8a8 = (_Base_ptr)local_8c8._24_8_;
  local_5a8._0_8_ = local_598;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5a8,"CMAKE_DEPENDS_IN_PROJECT_ONLY","");
  psVar10 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_5a8);
  value._M_str = extraout_RDX;
  value._M_len = (size_t)(psVar10->_M_dataplus)._M_p;
  bVar7 = cmValue::IsOn((cmValue *)psVar10->_M_string_length,value);
  if ((undefined1 *)local_5a8._0_8_ != local_598) {
    operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
  }
  local_878.Verbose = verbose;
  local_878.LocalGenerator = this;
  if (bVar7) {
    psVar10 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)this);
    pcVar3 = (psVar10->_M_dataplus)._M_p;
    sVar2 = psVar10->_M_string_length;
    psVar10 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    pcVar4 = (psVar10->_M_dataplus)._M_p;
    sVar5 = psVar10->_M_string_length;
    local_5a8._8_8_ = (cmLocalUnixMakefileGenerator3 *)0x0;
    local_5a8._0_8_ = operator_new(0x20);
    *(size_type *)local_5a8._0_8_ = sVar2;
    *(pointer *)(local_5a8._0_8_ + 8) = pcVar3;
    *(size_type *)(local_5a8._0_8_ + 0x10) = sVar5;
    *(pointer *)(local_5a8._0_8_ + 0x18) = pcVar4;
    local_598._8_8_ =
         std::
         _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(anonymous_namespace)::NotInProjectDir>
         ::_M_invoke;
    local_598._0_8_ =
         std::
         _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(anonymous_namespace)::NotInProjectDir>
         ::_M_manager;
  }
  else {
    local_598._0_8_ = (code *)0x0;
    local_598._8_8_ = (cmFileTimeCache *)0x0;
    local_5a8._0_8_ = (size_type *)0x0;
    local_5a8._8_8_ = (cmLocalUnixMakefileGenerator3 *)0x0;
  }
  bVar7 = cmDependsCompiler::CheckDependencies
                    (&local_878,(string *)local_938,&local_828,(DependencyMap *)local_8c8,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)local_5a8);
  if ((code *)local_598._0_8_ != (code *)0x0) {
    (*(code *)local_598._0_8_)(local_5a8,local_5a8,3);
  }
  if (bVar7) {
LAB_004f8503:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)local_8c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_910._M_dataplus._M_p != &local_910.field_2) {
      operator_delete(local_910._M_dataplus._M_p,local_910.field_2._M_allocated_capacity + 1);
    }
    if ((cmFileTimeCache *)local_938._0_8_ != (cmFileTimeCache *)(local_938 + 0x10)) {
      operator_delete((void *)local_938._0_8_,local_938._16_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_828);
  }
  else {
    if (verbose) {
      local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_868,local_898._M_dataplus._M_p,
                 local_898._M_dataplus._M_p + local_898._M_string_length);
      cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                ((cmCMakePath *)local_810,&local_868,generic_format);
      cmCMakePath::GetFileName((cmCMakePath *)local_5a8,(cmCMakePath *)local_810);
      this_01 = &cmCMakePath::RemoveExtension((cmCMakePath *)local_5a8)->Path;
      std::filesystem::__cxx11::path::
      generic_string<char,std::char_traits<char>,std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_848,
                 this_01,&local_911);
      std::filesystem::__cxx11::path::~path((path *)local_5a8);
      std::filesystem::__cxx11::path::~path((path *)local_810);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_868._M_dataplus._M_p != &local_868.field_2) {
        operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
      }
      local_5a8._0_8_ = &DAT_00000036;
      local_5a8._8_8_ = "Consolidate compiler generated dependencies of target ";
      local_598._0_8_ = local_848._8_8_;
      local_598._8_8_ = local_848._0_8_;
      views_03._M_len = 2;
      views_03._M_array = (iterator)local_5a8;
      cmCatViews_abi_cxx11_((string *)local_810,views_03);
      cmSystemTools::MakefileColorEcho(0x106,(char *)local_810._0_8_,true,local_8cc._0_1_);
      if ((cmFileTimeCache *)local_810._0_8_ != local_800) {
        operator_delete((void *)local_810._0_8_,(long)local_800[0].Cache._M_h._M_buckets + 1);
      }
      if ((cmFileTimeCache *)local_848._0_8_ != (cmFileTimeCache *)(local_848 + 0x10)) {
        operator_delete((void *)local_848._0_8_,local_848._16_8_ + 1);
      }
    }
    EVar9 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_5a8,&local_910,false,EVar9);
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_5a8,true);
    if ((*(byte *)((long)&local_588._M_impl._M_t.
                          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          .
                          super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                          ._M_head_impl + *(size_type *)(local_5a8._0_8_ + -0x18)) & 5) == 0) {
      EVar9 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                _vptr_cmGlobalGenerator[5])();
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_810,(string *)local_938,false,EVar9);
      if ((*(byte *)((long)&local_800[0].Cache._M_h._M_before_begin._M_nxt +
                    *(long *)(local_810._0_8_ + -0x18)) & 5) == 0) {
        WriteDisclaimer(this,(ostream *)local_5a8);
        WriteDisclaimer(this,(ostream *)local_810);
        cmDependsCompiler::WriteDependencies
                  (&local_878,(DependencyMap *)local_8c8,(ostream *)local_5a8,(ostream *)local_810);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_810);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_5a8);
        goto LAB_004f8503;
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_810);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_5a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)local_8c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_910._M_dataplus._M_p != &local_910.field_2) {
      operator_delete(local_910._M_dataplus._M_p,local_910.field_2._M_allocated_capacity + 1);
    }
    if ((cmFileTimeCache *)local_938._0_8_ != (cmFileTimeCache *)(local_938 + 0x10)) {
      operator_delete((void *)local_938._0_8_,local_938._16_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_828);
    bVar6 = false;
  }
LAB_004f87a9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
    operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898._M_dataplus._M_p != &local_898.field_2) {
    operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool cmLocalUnixMakefileGenerator3::UpdateDependencies(
  const std::string& tgtInfo, bool verbose, bool color)
{
  // read in the target info file
  if (!this->Makefile->ReadListFile(tgtInfo) ||
      cmSystemTools::GetErrorOccurredFlag()) {
    cmSystemTools::Error("Target DependInfo.cmake file not found");
  }

  bool status = true;

  // Check if any multiple output pairs have a missing file.
  this->CheckMultipleOutputs(verbose);

  std::string const targetDir = cmSystemTools::GetFilenamePath(tgtInfo);
  if (!this->Makefile->GetSafeDefinition("CMAKE_DEPENDS_LANGUAGES").empty()) {
    // dependencies are managed by CMake itself

    std::string const internalDependFile = targetDir + "/depend.internal";
    std::string const dependFile = targetDir + "/depend.make";

    // If the target DependInfo.cmake file has changed since the last
    // time dependencies were scanned then force rescanning.  This may
    // happen when a new source file is added and CMake regenerates the
    // project but no other sources were touched.
    bool needRescanDependInfo = false;
    cmFileTimeCache* ftc =
      this->GlobalGenerator->GetCMakeInstance()->GetFileTimeCache();
    {
      int result;
      if (!ftc->Compare(internalDependFile, tgtInfo, &result) || result < 0) {
        if (verbose) {
          cmSystemTools::Stdout(cmStrCat("Dependee \"", tgtInfo,
                                         "\" is newer than depender \"",
                                         internalDependFile, "\".\n"));
        }
        needRescanDependInfo = true;
      }
    }

    // If the directory information is newer than depend.internal, include
    // dirs may have changed. In this case discard all old dependencies.
    bool needRescanDirInfo = false;
    {
      std::string dirInfoFile =
        cmStrCat(this->GetCurrentBinaryDirectory(),
                 "/CMakeFiles/CMakeDirectoryInformation.cmake");
      int result;
      if (!ftc->Compare(internalDependFile, dirInfoFile, &result) ||
          result < 0) {
        if (verbose) {
          cmSystemTools::Stdout(cmStrCat("Dependee \"", dirInfoFile,
                                         "\" is newer than depender \"",
                                         internalDependFile, "\".\n"));
        }
        needRescanDirInfo = true;
      }
    }

    // Check the implicit dependencies to see if they are up to date.
    // The build.make file may have explicit dependencies for the object
    // files but these will not affect the scanning process so they need
    // not be considered.
    cmDepends::DependencyMap validDependencies;
    bool needRescanDependencies = false;
    if (!needRescanDirInfo) {
      cmDependsC checker;
      checker.SetVerbose(verbose);
      checker.SetFileTimeCache(ftc);
      // cmDependsC::Check() fills the vector validDependencies() with the
      // dependencies for those files where they are still valid, i.e.
      // neither the files themselves nor any files they depend on have
      // changed. We don't do that if the CMakeDirectoryInformation.cmake
      // file has changed, because then potentially all dependencies have
      // changed. This information is given later on to cmDependsC, which
      // then only rescans the files where it did not get valid dependencies
      // via this dependency vector. This means that in the normal case, when
      // only few or one file have been edited, then also only this one file
      // is actually scanned again, instead of all files for this target.
      needRescanDependencies =
        !checker.Check(dependFile, internalDependFile, validDependencies);
    }

    if (needRescanDependInfo || needRescanDirInfo || needRescanDependencies) {
      // The dependencies must be regenerated.
      if (verbose) {
        std::string targetName = cmSystemTools::GetFilenameName(targetDir);
        targetName = targetName.substr(0, targetName.length() - 4);
        std::string message =
          cmStrCat("Scanning dependencies of target ", targetName);
        cmSystemTools::MakefileColorEcho(
          cmsysTerminal_Color_ForegroundMagenta |
            cmsysTerminal_Color_ForegroundBold,
          message.c_str(), true, color);
      }

      status = this->ScanDependencies(targetDir, dependFile,
                                      internalDependFile, validDependencies);
    }
  }

  auto depends =
    this->Makefile->GetSafeDefinition("CMAKE_DEPENDS_DEPENDENCY_FILES");
  if (!depends.empty()) {
    // dependencies are managed by compiler
    auto depFiles = cmExpandedList(depends, true);
    std::string const internalDepFile =
      targetDir + "/compiler_depend.internal";
    std::string const depFile = targetDir + "/compiler_depend.make";
    cmDepends::DependencyMap dependencies;
    cmDependsCompiler depsManager;
    bool projectOnly = cmIsOn(
      this->Makefile->GetSafeDefinition("CMAKE_DEPENDS_IN_PROJECT_ONLY"));

    depsManager.SetVerbose(verbose);
    depsManager.SetLocalGenerator(this);

    if (!depsManager.CheckDependencies(
          internalDepFile, depFiles, dependencies,
          projectOnly ? NotInProjectDir(this->GetSourceDirectory(),
                                        this->GetBinaryDirectory())
                      : std::function<bool(const std::string&)>())) {
      // regenerate dependencies files
      if (verbose) {
        std::string targetName = cmCMakePath(targetDir)
                                   .GetFileName()
                                   .RemoveExtension()
                                   .GenericString();
        auto message =
          cmStrCat("Consolidate compiler generated dependencies of target ",
                   targetName);
        cmSystemTools::MakefileColorEcho(
          cmsysTerminal_Color_ForegroundMagenta |
            cmsysTerminal_Color_ForegroundBold,
          message.c_str(), true, color);
      }

      // Open the make depends file.  This should be copy-if-different
      // because the make tool may try to reload it needlessly otherwise.
      cmGeneratedFileStream ruleFileStream(
        depFile, false, this->GlobalGenerator->GetMakefileEncoding());
      ruleFileStream.SetCopyIfDifferent(true);
      if (!ruleFileStream) {
        return false;
      }

      // Open the cmake dependency tracking file.  This should not be
      // copy-if-different because dependencies are re-scanned when it is
      // older than the DependInfo.cmake.
      cmGeneratedFileStream internalRuleFileStream(
        internalDepFile, false, this->GlobalGenerator->GetMakefileEncoding());
      if (!internalRuleFileStream) {
        return false;
      }

      this->WriteDisclaimer(ruleFileStream);
      this->WriteDisclaimer(internalRuleFileStream);

      depsManager.WriteDependencies(dependencies, ruleFileStream,
                                    internalRuleFileStream);
    }
  }

  // The dependencies are already up-to-date.
  return status;
}